

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUtilitySourceCommand.cxx
# Opt level: O3

bool __thiscall
cmUtilitySourceCommand::InitialPass
          (cmUtilitySourceCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  cmUtilitySourceCommand *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  cmState *this_00;
  long *plVar9;
  long *plVar10;
  size_type *psVar11;
  string *psVar12;
  string utilityDirectory;
  string utilitySource;
  string utilityExecutable;
  string cmakeCFGout;
  string exePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string local_190;
  string local_170;
  string local_150;
  cmUtilitySourceCommand *local_130;
  string *local_128;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  undefined1 *local_100;
  char *local_f8;
  undefined1 local_f0;
  undefined7 uStack_ef;
  long *local_e0 [2];
  long local_d0 [2];
  long *local_c0;
  long local_b8;
  long local_b0;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  string *local_a0;
  ulong local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  psVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_98 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar12;
  if (local_98 < 0x41) {
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p == &local_170.field_2) goto LAB_002f3b98;
  }
  else {
    local_128 = psVar12;
    pcVar7 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,psVar12);
    pcVar2 = (this->super_cmCommand).Makefile;
    paVar1 = &local_170.field_2;
    local_170._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"CMAKE_CFG_INTDIR","");
    pcVar8 = cmMakefile::GetRequiredDefinition(pcVar2,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->super_cmCommand).Makefile;
    local_170._M_dataplus._M_p = (pointer)paVar1;
    local_130 = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"CMAKE_CROSSCOMPILING","");
    bVar4 = cmMakefile::IsOn(pcVar2,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      if (pcVar7 != (char *)0x0) goto LAB_002f3b98;
      local_170._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_170,"UTILITY_SOURCE is used in cross compiling mode for ","");
      std::__cxx11::string::_M_append((char *)&local_170,(ulong)(local_128->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_170);
      cmSystemTools::Message(local_170._M_dataplus._M_p,"Warning");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != paVar1) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      this_00 = cmMakefile::GetState((local_130->super_cmCommand).Makefile);
      if (((pcVar7 != (char *)0x0) &&
          (((pcVar7 = strstr(pcVar7,"(IntDir)"), pcVar7 == (char *)0x0 ||
            ((pcVar8 != (char *)0x0 && (iVar5 = strcmp(pcVar8,"$(IntDir)"), iVar5 == 0)))) &&
           (uVar6 = cmState::GetCacheMajorVersion(this_00), uVar6 != 0)))) &&
         (uVar6 = cmState::GetCacheMinorVersion(this_00), uVar6 != 0)) goto LAB_002f3b98;
    }
    pcVar7 = cmMakefile::GetCurrentSourceDirectory((local_130->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)&local_170,pcVar7,(allocator *)&local_120);
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,local_170._M_dataplus._M_p,
               local_170._M_dataplus._M_p + local_170._M_string_length);
    psVar12 = local_128;
    std::__cxx11::string::append((char *)&local_190);
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_190,(ulong)psVar12[2]._M_dataplus._M_p);
    plVar10 = plVar9 + 2;
    if ((long *)*plVar9 == plVar10) {
      local_110 = *plVar10;
      lStack_108 = plVar9[3];
      local_120 = &local_110;
    }
    else {
      local_110 = *plVar10;
      local_120 = (long *)*plVar9;
    }
    local_118 = plVar9[1];
    *plVar9 = (long)plVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_170,(string *)&local_120);
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    bVar4 = cmsys::SystemTools::FileExists(local_170._M_dataplus._M_p);
    if (bVar4) {
      local_a0 = local_128 + 2;
      psVar12 = local_128 + 3;
      do {
        pcVar3 = local_130;
        if (psVar12 ==
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          pcVar2 = (local_130->super_cmCommand).Makefile;
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_190,"CMAKE_CFG_INTDIR","");
          pcVar7 = cmMakefile::GetRequiredDefinition(pcVar2,&local_190);
          std::__cxx11::string::string((string *)&local_120,pcVar7,(allocator *)&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          pcVar7 = cmMakefile::GetCurrentBinaryDirectory((pcVar3->super_cmCommand).Makefile);
          std::__cxx11::string::string((string *)&local_190,pcVar7,(allocator *)&local_100);
          local_100 = &local_f0;
          local_f8 = (char *)0x0;
          local_f0 = 0;
          pcVar2 = (pcVar3->super_cmCommand).Makefile;
          paVar1 = &local_150.field_2;
          local_150._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_150,"EXECUTABLE_OUTPUT_PATH","");
          pcVar7 = cmMakefile::GetDefinition(pcVar2,&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != paVar1) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if (pcVar7 != (char *)0x0) {
            pcVar2 = (local_130->super_cmCommand).Makefile;
            local_150._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_150,"EXECUTABLE_OUTPUT_PATH","");
            pcVar8 = cmMakefile::GetDefinition(pcVar2,&local_150);
            pcVar7 = local_f8;
            strlen(pcVar8);
            std::__cxx11::string::_M_replace((ulong)&local_100,0,pcVar7,(ulong)pcVar8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != paVar1) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (local_f8 == (char *)0x0) {
            std::operator+(&local_150,"/",local_a0);
            std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_150._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != paVar1) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            std::__cxx11::string::_M_assign((string *)&local_190);
          }
          local_e0[0] = local_d0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_e0,local_190._M_dataplus._M_p,
                     local_190._M_dataplus._M_p + local_190._M_string_length);
          std::__cxx11::string::append((char *)local_e0);
          plVar9 = (long *)std::__cxx11::string::_M_append((char *)local_e0,(ulong)local_120);
          plVar10 = plVar9 + 2;
          if ((long *)*plVar9 == plVar10) {
            local_80 = *plVar10;
            lStack_78 = plVar9[3];
            local_90 = &local_80;
          }
          else {
            local_80 = *plVar10;
            local_90 = (long *)*plVar9;
          }
          local_88 = plVar9[1];
          *plVar9 = (long)plVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_90);
          plVar10 = plVar9 + 2;
          if ((long *)*plVar9 == plVar10) {
            local_60 = *plVar10;
            lStack_58 = plVar9[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *plVar10;
            local_70 = (long *)*plVar9;
          }
          local_68 = plVar9[1];
          *plVar9 = (long)plVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_70,(ulong)local_128[1]._M_dataplus._M_p);
          plVar10 = plVar9 + 2;
          if ((long *)*plVar9 == plVar10) {
            local_b0 = *plVar10;
            uStack_a8 = (undefined4)plVar9[3];
            uStack_a4 = *(undefined4 *)((long)plVar9 + 0x1c);
            local_c0 = &local_b0;
          }
          else {
            local_b0 = *plVar10;
            local_c0 = (long *)*plVar9;
          }
          local_b8 = plVar9[1];
          *plVar9 = (long)plVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          pcVar2 = (local_130->super_cmCommand).Makefile;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"CMAKE_EXECUTABLE_SUFFIX","");
          cmMakefile::GetDefinition(pcVar2,&local_50);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_c0);
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          psVar11 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_150.field_2._M_allocated_capacity = *psVar11;
            local_150.field_2._8_8_ = plVar9[3];
          }
          else {
            local_150.field_2._M_allocated_capacity = *psVar11;
            local_150._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_150._M_string_length = plVar9[1];
          *plVar9 = (long)psVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (local_c0 != &local_b0) {
            operator_delete(local_c0,local_b0 + 1);
          }
          if (local_70 != &local_60) {
            operator_delete(local_70,local_60 + 1);
          }
          psVar12 = local_128;
          if (local_90 != &local_80) {
            operator_delete(local_90,local_80 + 1);
          }
          if (local_e0[0] != local_d0) {
            operator_delete(local_e0[0],local_d0[0] + 1);
          }
          cmsys::SystemTools::ReplaceString(&local_150,"/./","/");
          cmMakefile::AddCacheDefinition
                    ((local_130->super_cmCommand).Makefile,psVar12,local_150._M_dataplus._M_p,
                     "Path to an internal program.",FILEPATH,false);
          cmsys::SystemTools::ConvertToUnixSlashes(&local_150);
          cmMakefile::AddCacheDefinition
                    ((local_130->super_cmCommand).Makefile,&local_150,psVar12[1]._M_dataplus._M_p,
                     "Executable to project name.",INTERNAL,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if (local_100 != &local_f0) {
            operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if (local_120 != &local_110) {
            operator_delete(local_120,local_110 + 1);
          }
          break;
        }
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_190,local_170._M_dataplus._M_p,
                   local_170._M_dataplus._M_p + local_170._M_string_length);
        std::__cxx11::string::append((char *)&local_190);
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_190,(ulong)(psVar12->_M_dataplus)._M_p);
        plVar10 = plVar9 + 2;
        if ((long *)*plVar9 == plVar10) {
          local_110 = *plVar10;
          lStack_108 = plVar9[3];
          local_120 = &local_110;
        }
        else {
          local_110 = *plVar10;
          local_120 = (long *)*plVar9;
        }
        local_118 = plVar9[1];
        *plVar9 = (long)plVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        bVar4 = cmsys::SystemTools::FileExists((char *)local_120);
        if (local_120 != &local_110) {
          operator_delete(local_120,local_110 + 1);
        }
        psVar12 = psVar12 + 1;
      } while (bVar4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p == &local_170.field_2) goto LAB_002f3b98;
  }
  operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
LAB_002f3b98:
  return 0x40 < local_98;
}

Assistant:

bool cmUtilitySourceCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.size() < 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::vector<std::string>::const_iterator arg = args.begin();

  // The first argument is the cache entry name.
  std::string const& cacheEntry = *arg++;
  const char* cacheValue = this->Makefile->GetDefinition(cacheEntry);
  // If it exists already and appears up to date then we are done.  If
  // the string contains "(IntDir)" but that is not the
  // CMAKE_CFG_INTDIR setting then the value is out of date.
  const char* intDir =
    this->Makefile->GetRequiredDefinition("CMAKE_CFG_INTDIR");

  bool haveCacheValue = false;
  if (this->Makefile->IsOn("CMAKE_CROSSCOMPILING")) {
    haveCacheValue = (cacheValue != CM_NULLPTR);
    if (!haveCacheValue) {
      std::string msg = "UTILITY_SOURCE is used in cross compiling mode for ";
      msg += cacheEntry;
      msg += ". If your intention is to run this executable, you need to "
             "preload the cache with the full path to a version of that "
             "program, which runs on this build machine.";
      cmSystemTools::Message(msg.c_str(), "Warning");
    }
  } else {
    cmState* state = this->Makefile->GetState();
    haveCacheValue =
      (cacheValue && (strstr(cacheValue, "(IntDir)") == CM_NULLPTR ||
                      (intDir && strcmp(intDir, "$(IntDir)") == 0)) &&
       (state->GetCacheMajorVersion() != 0 &&
        state->GetCacheMinorVersion() != 0));
  }

  if (haveCacheValue) {
    return true;
  }

  // The second argument is the utility's executable name, which will be
  // needed later.
  std::string const& utilityName = *arg++;

  // The third argument specifies the relative directory of the source
  // of the utility.
  std::string const& relativeSource = *arg++;
  std::string utilitySource = this->Makefile->GetCurrentSourceDirectory();
  utilitySource = utilitySource + "/" + relativeSource;

  // If the directory doesn't exist, the source has not been included.
  if (!cmSystemTools::FileExists(utilitySource.c_str())) {
    return true;
  }

  // Make sure all the files exist in the source directory.
  while (arg != args.end()) {
    std::string file = utilitySource + "/" + *arg++;
    if (!cmSystemTools::FileExists(file.c_str())) {
      return true;
    }
  }

  // The source exists.
  std::string cmakeCFGout =
    this->Makefile->GetRequiredDefinition("CMAKE_CFG_INTDIR");
  std::string utilityDirectory = this->Makefile->GetCurrentBinaryDirectory();
  std::string exePath;
  if (this->Makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH")) {
    exePath = this->Makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH");
  }
  if (!exePath.empty()) {
    utilityDirectory = exePath;
  } else {
    utilityDirectory += "/" + relativeSource;
  }

  // Construct the cache entry for the executable's location.
  std::string utilityExecutable = utilityDirectory + "/" + cmakeCFGout + "/" +
    utilityName + this->Makefile->GetDefinition("CMAKE_EXECUTABLE_SUFFIX");

  // make sure we remove any /./ in the name
  cmSystemTools::ReplaceString(utilityExecutable, "/./", "/");

  // Enter the value into the cache.
  this->Makefile->AddCacheDefinition(cacheEntry, utilityExecutable.c_str(),
                                     "Path to an internal program.",
                                     cmStateEnums::FILEPATH);
  // add a value into the cache that maps from the
  // full path to the name of the project
  cmSystemTools::ConvertToUnixSlashes(utilityExecutable);
  this->Makefile->AddCacheDefinition(utilityExecutable, utilityName.c_str(),
                                     "Executable to project name.",
                                     cmStateEnums::INTERNAL);

  return true;
}